

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void nni_msg_header_append_u32(nni_msg *m,uint32_t val)

{
  undefined1 *puVar1;
  uint8_t *dst;
  uint32_t val_local;
  nni_msg *m_local;
  
  if (0x3f < m->m_header_len + 4) {
    nni_panic("impossible header over-run");
  }
  puVar1 = (undefined1 *)((long)m->m_header_buf + m->m_header_len);
  *puVar1 = (char)(val >> 0x18);
  puVar1[1] = (char)(val >> 0x10);
  puVar1[2] = (char)(val >> 8);
  puVar1[3] = (char)val;
  m->m_header_len = m->m_header_len + 4;
  return;
}

Assistant:

void
nni_msg_header_append_u32(nni_msg *m, uint32_t val)
{
	uint8_t *dst;
	if ((m->m_header_len + sizeof(val)) >= (sizeof(m->m_header_buf))) {
		nni_panic("impossible header over-run");
	}
	dst = (void *) m->m_header_buf;
	dst += m->m_header_len;
	NNI_PUT32(dst, val);
	m->m_header_len += sizeof(val);
}